

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O3

bool xercesc_4_0::XIncludeUtils::isXIFallbackElement(XMLCh *name,XMLCh *namespaceURI)

{
  short *psVar1;
  short *psVar2;
  long lVar3;
  
  if (name != (XMLCh *)0x0 && namespaceURI != (XMLCh *)0x0) {
    if (name == L"fallback") {
LAB_0033d2eb:
      if (namespaceURI == L"http://www.w3.org/2001/XInclude") {
        return true;
      }
      lVar3 = 0;
      do {
        psVar1 = (short *)((long)namespaceURI + lVar3);
        if (*psVar1 == 0) {
          if (*(short *)((long)&fgXIIIncludeNamespaceURI + lVar3) != 0) {
            return false;
          }
          return true;
        }
        psVar2 = (short *)((long)&fgXIIIncludeNamespaceURI + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 == *psVar2);
    }
    else {
      lVar3 = 0;
      do {
        psVar1 = (short *)((long)name + lVar3);
        if (*psVar1 == 0) {
          if (*(short *)((long)&fgXIFallbackQName + lVar3) != 0) {
            return false;
          }
          goto LAB_0033d2eb;
        }
        psVar2 = (short *)((long)&fgXIFallbackQName + lVar3);
        lVar3 = lVar3 + 2;
      } while (*psVar1 == *psVar2);
    }
  }
  return false;
}

Assistant:

bool
XIncludeUtils::isXIFallbackElement(const XMLCh *name, const XMLCh *namespaceURI){
    if (namespaceURI == NULL || name == NULL){
        /* no namespaces not supported */
        return false;
    }
    if (XMLString::equals(name, fgXIFallbackQName)
        && XMLString::equals(namespaceURI, fgXIIIncludeNamespaceURI)){
        return true;
    }
    return false;
}